

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::Write(LogLevel logLevel,string *str)

{
  char *pcVar1;
  ostream *poVar2;
  
  std::mutex::lock(&s_mutex);
  poVar2 = (ostream *)&std::cerr;
  if (logLevel == Error) {
    pcVar1 = "[Error] ";
  }
  else if (logLevel == Info) {
    pcVar1 = "[Info] ";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[LogLevel: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,logLevel);
    pcVar1 = "] ";
  }
  std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)str);
  std::endl<char,std::char_traits<char>>(poVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&s_mutex);
  return;
}

Assistant:

void Logger::Write(LogLevel logLevel, std::string str)
{
    std::lock_guard<std::mutex> l(s_mutex);
    switch (logLevel)
    {
    case LogLevel::Info:
        std::cerr << "[Info] ";
        break;
    case LogLevel::Error:
        std::cerr << "[Error] ";
        break;
    default:
        std::cerr << "[LogLevel: " << static_cast<std::underlying_type<LogLevel>::type>(logLevel) << "] ";
        break;
    }
    std::cerr << str << std::endl;
}